

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__psd_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi__uint32 sVar1;
  int iVar2;
  int local_38;
  int local_34;
  int dummy;
  int channelCount;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi__context *s_local;
  
  y_local = x;
  if (x == (int *)0x0) {
    y_local = &local_38;
  }
  comp_local = y;
  if (y == (int *)0x0) {
    comp_local = &local_38;
  }
  _dummy = comp;
  if (comp == (int *)0x0) {
    _dummy = &local_38;
  }
  x_local = (int *)s;
  sVar1 = stbi__get32be(s);
  if (sVar1 == 0x38425053) {
    iVar2 = stbi__get16be((stbi__context *)x_local);
    if (iVar2 == 1) {
      stbi__skip((stbi__context *)x_local,6);
      local_34 = stbi__get16be((stbi__context *)x_local);
      if ((local_34 < 0) || (0x10 < local_34)) {
        stbi__rewind((stbi__context *)x_local);
        s_local._4_4_ = 0;
      }
      else {
        sVar1 = stbi__get32be((stbi__context *)x_local);
        *comp_local = sVar1;
        sVar1 = stbi__get32be((stbi__context *)x_local);
        *y_local = sVar1;
        iVar2 = stbi__get16be((stbi__context *)x_local);
        if (iVar2 == 8) {
          iVar2 = stbi__get16be((stbi__context *)x_local);
          if (iVar2 == 3) {
            *_dummy = 4;
            s_local._4_4_ = 1;
          }
          else {
            stbi__rewind((stbi__context *)x_local);
            s_local._4_4_ = 0;
          }
        }
        else {
          stbi__rewind((stbi__context *)x_local);
          s_local._4_4_ = 0;
        }
      }
    }
    else {
      stbi__rewind((stbi__context *)x_local);
      s_local._4_4_ = 0;
    }
  }
  else {
    stbi__rewind((stbi__context *)x_local);
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__psd_info(stbi__context *s, int *x, int *y, int *comp)
{
   int channelCount, dummy;
   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;
   if (stbi__get32be(s) != 0x38425053) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 1) {
       stbi__rewind( s );
       return 0;
   }
   stbi__skip(s, 6);
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16) {
       stbi__rewind( s );
       return 0;
   }
   *y = stbi__get32be(s);
   *x = stbi__get32be(s);
   if (stbi__get16be(s) != 8) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 3) {
       stbi__rewind( s );
       return 0;
   }
   *comp = 4;
   return 1;
}